

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *
vkt::pipeline::anon_unknown_0::getMipLevelSizes
          (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
           *__return_storage_ptr__,IVec4 *baseSize)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  IVec4 *baseSize_local;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *levels;
  
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (__return_storage_ptr__);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
            (__return_storage_ptr__,baseSize);
  while( true ) {
    piVar2 = tcu::Vector<int,_4>::x(baseSize);
    bVar3 = true;
    if (*piVar2 == 1) {
      piVar2 = tcu::Vector<int,_4>::y(baseSize);
      bVar3 = true;
      if (*piVar2 == 1) {
        piVar2 = tcu::Vector<int,_4>::z(baseSize);
        bVar3 = *piVar2 != 1;
      }
    }
    if (!bVar3) break;
    piVar2 = tcu::Vector<int,_4>::x(baseSize);
    iVar1 = deMax32(*piVar2 >> 1,1);
    piVar2 = tcu::Vector<int,_4>::x(baseSize);
    *piVar2 = iVar1;
    piVar2 = tcu::Vector<int,_4>::y(baseSize);
    iVar1 = deMax32(*piVar2 >> 1,1);
    piVar2 = tcu::Vector<int,_4>::y(baseSize);
    *piVar2 = iVar1;
    piVar2 = tcu::Vector<int,_4>::z(baseSize);
    iVar1 = deMax32(*piVar2 >> 1,1);
    piVar2 = tcu::Vector<int,_4>::z(baseSize);
    *piVar2 = iVar1;
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (__return_storage_ptr__,baseSize);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<IVec4> getMipLevelSizes (IVec4 baseSize)
{
	vector<IVec4> levels;
	levels.push_back(baseSize);

	while (baseSize.x() != 1 || baseSize.y() != 1 || baseSize.z() != 1)
	{
		baseSize.x() = deMax32(baseSize.x() >> 1, 1);
		baseSize.y() = deMax32(baseSize.y() >> 1, 1);
		baseSize.z() = deMax32(baseSize.z() >> 1, 1);
		levels.push_back(baseSize);
	}

	return levels;
}